

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Float32_To_Int16_Clip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float *src;
  PaInt16 *dest;
  bool bVar1;
  float fVar2;
  float fVar3;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    fVar3 = -32768.0;
    if (-32768.0 <= *sourceBuffer * 32767.0) {
      fVar3 = *sourceBuffer * 32767.0;
    }
    fVar2 = 32767.0;
    if (fVar3 <= 32767.0) {
      fVar2 = fVar3;
    }
    *(short *)destinationBuffer = (short)(int)fVar2;
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 2);
  }
  return;
}

Assistant:

static void Float32_To_Int16_Clip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    PaInt16 *dest =  (PaInt16*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
#ifdef PA_USE_C99_LRINTF
        long samp = lrintf((*src * (32767.0f)) -0.5f);
#else
        long samp = (PaInt32) (*src * (32767.0f));
#endif
        PA_CLIP_( samp, -0x8000, 0x7FFF );
        *dest = (PaInt16) samp;

        src += sourceStride;
        dest += destinationStride;
    }
}